

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O1

void __thiscall wallet::COutput::ApplyBumpFee(COutput *this,CAmount bump_fee)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bump_fee < 0) {
    __assert_fail("bump_fee >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
                  ,0x72,"void wallet::COutput::ApplyBumpFee(CAmount)");
  }
  this->ancestor_bump_fees = bump_fee;
  if ((this->fee).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged != false) {
    lVar2 = bump_fee +
            (this->fee).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._M_value;
    (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_payload._M_value = lVar2;
    (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value = (this->txout).nValue - lVar2;
    (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = true;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("fee",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
                ,0x74,"void wallet::COutput::ApplyBumpFee(CAmount)");
}

Assistant:

void ApplyBumpFee(CAmount bump_fee)
    {
        assert(bump_fee >= 0);
        ancestor_bump_fees = bump_fee;
        assert(fee);
        *fee += bump_fee;
        // Note: assert(effective_value - bump_fee == nValue - fee.value());
        effective_value = txout.nValue - fee.value();
    }